

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugRangeList::dump(DWARFDebugRangeList *this,raw_ostream *OS)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pRVar3;
  RangeListEntry *RLE;
  pointer pRVar4;
  format_object_base local_58;
  undefined1 local_48 [16];
  uint64_t local_38;
  
  pRVar3 = (this->Entries).
           super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->Entries).
                super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar3; pRVar4 = pRVar4 + 1) {
    local_58.Fmt = "%08lx %016lx %016lx\n";
    if (this->AddressSize == '\x04') {
      local_58.Fmt = "%08lx %08lx %08lx\n";
    }
    local_58._vptr_format_object_base = (_func_int **)&PTR_home_010785f0;
    uVar1 = pRVar4->StartAddress;
    uVar2 = pRVar4->EndAddress;
    local_48._8_4_ = (int)uVar1;
    local_48._0_8_ = uVar2;
    local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
    local_38 = this->Offset;
    raw_ostream::operator<<(OS,&local_58);
    local_48._0_8_ = local_48._8_8_;
  }
  local_58.Fmt = "%08lx <End of list>\n";
  local_58._vptr_format_object_base = (_func_int **)&PTR_home_01077fc8;
  local_48._8_8_ = local_48._0_8_;
  local_48._0_8_ = this->Offset;
  raw_ostream::operator<<(OS,&local_58);
  return;
}

Assistant:

void DWARFDebugRangeList::dump(raw_ostream &OS) const {
  for (const RangeListEntry &RLE : Entries) {
    const char *format_str =
        (AddressSize == 4 ? "%08" PRIx64 " %08" PRIx64 " %08" PRIx64 "\n"
                          : "%08" PRIx64 " %016" PRIx64 " %016" PRIx64 "\n");
    OS << format(format_str, Offset, RLE.StartAddress, RLE.EndAddress);
  }
  OS << format("%08" PRIx64 " <End of list>\n", Offset);
}